

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall soplex::CLUFactor<double>::solveLleftForestNoNZ(CLUFactor<double> *this,double *vec)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  double *pdVar8;
  long in_RSI;
  long in_RDI;
  int *lbeg;
  int *lrow;
  int *lidx;
  int *idx;
  double *lval;
  double *val;
  double x;
  int end;
  int k;
  int j;
  int i;
  int *local_40;
  double *local_30;
  int local_18;
  int local_14;
  
  pdVar8 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x2620c5);
  lVar4 = *(long *)(in_RDI + 0x78);
  lVar5 = *(long *)(in_RDI + 0x98);
  lVar6 = *(long *)(in_RDI + 0x90);
  iVar2 = *(int *)(in_RDI + 0x84);
  local_14 = *(int *)(in_RDI + 0x88);
  while (iVar7 = local_14, local_14 = iVar7 + -1, iVar2 <= local_14) {
    dVar1 = *(double *)(in_RSI + (long)*(int *)(lVar5 + (long)local_14 * 4) * 8);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      iVar3 = *(int *)(lVar6 + (long)local_14 * 4);
      local_40 = (int *)(lVar4 + (long)iVar3 * 4);
      local_30 = pdVar8 + iVar3;
      for (local_18 = *(int *)(lVar6 + (long)iVar7 * 4); iVar3 < local_18; local_18 = local_18 + -1)
      {
        *(double *)(in_RSI + (long)*local_40 * 8) =
             *(double *)(in_RSI + (long)*local_40 * 8) - dVar1 * *local_30;
        local_40 = local_40 + 1;
        local_30 = local_30 + 1;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLleftForestNoNZ(R* vec)
{
   int i, j, k, end;
   R x;
   R* val, *lval;
   int* idx, *lidx, *lrow, *lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         assert(i >= 0 && i < l.size);
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         val = &lval[k];
         idx = &lidx[k];

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            vec[*idx++] -= x * (*val++);
         }
      }
   }
}